

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skynet_timer.c
# Opt level: O3

void skynet_timer_init(void)

{
  timer *ptVar1;
  long lVar2;
  link_list (*palVar3) [64];
  long lVar4;
  uint64_t uVar5;
  timespec ti;
  timespec local_20;
  
  ptVar1 = (timer *)calloc(1,0x3020);
  lVar2 = 0;
  do {
    *(undefined8 *)((long)&ptVar1->near[0].head.next + lVar2) = 0;
    *(long *)((long)&ptVar1->near[0].tail + lVar2) = (long)&ptVar1->near[0].head.next + lVar2;
    lVar2 = lVar2 + 0x18;
  } while (lVar2 != 0x1800);
  palVar3 = ptVar1->t;
  lVar2 = 0;
  do {
    lVar4 = 0;
    do {
      *(undefined8 *)((long)&(*palVar3)[0].head.next + lVar4) = 0;
      *(long *)((long)&(*palVar3)[0].tail + lVar4) = (long)&(*palVar3)[0].head.next + lVar4;
      lVar4 = lVar4 + 0x18;
    } while (lVar4 != 0x600);
    lVar2 = lVar2 + 1;
    palVar3 = palVar3 + 1;
  } while (lVar2 != 4);
  TI = ptVar1;
  clock_gettime(0,&local_20);
  ptVar1->starttime = (uint32_t)local_20.tv_sec;
  ptVar1->current =
       (int)(SUB168(SEXT816(local_20.tv_nsec) * ZEXT816(0xd6bf94d5e57a42bd),8) >> 0x17) -
       ((int)(local_20.tv_nsec / -0x6769800000000000) + (int)(local_20.tv_nsec >> 0x3f));
  clock_gettime(4,&local_20);
  ptVar1 = TI;
  uVar5 = local_20.tv_nsec / 10000000 +
          CONCAT44(local_20.tv_sec._4_4_,(uint32_t)local_20.tv_sec) * 100;
  TI->current_point = uVar5;
  ptVar1->origin_point = uVar5;
  return;
}

Assistant:

static struct timer *
timer_create_timer() {
	struct timer *r=(struct timer *)skynet_malloc(sizeof(struct timer));
	memset(r,0,sizeof(*r));

	int i,j;

	for (i=0;i<TIME_NEAR;i++) {
		link_clear(&r->near[i]);
	}

	for (i=0;i<4;i++) {
		for (j=0;j<TIME_LEVEL;j++) {
			link_clear(&r->t[i][j]);
		}
	}

	SPIN_INIT(r)

	r->current = 0;

	return r;
}